

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O1

bool __thiscall basisu::basis_compressor::read_source_images(basis_compressor *this)

{
  vector<basisu::image_stats> *vec;
  vector<basisu::image> *vec_00;
  basisu_backend_slice_desc_vec *this_00;
  float fVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  void *pvVar7;
  vector<basisu::image> *pvVar8;
  image_stats *piVar9;
  char *pcVar10;
  basisu_backend_slice_desc *pbVar11;
  long *plVar12;
  basisu_backend_slice_desc *pbVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  bool bVar17;
  uint __tmp;
  uint uVar18;
  uint32_t uVar19;
  uint uVar20;
  ulong uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  image *piVar23;
  uint32_t *puVar24;
  uint uVar25;
  int iVar26;
  image *piVar27;
  image *piVar28;
  uint uVar29;
  color_rgba *pcVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  char *pcVar36;
  ulong uVar37;
  ulong uVar38;
  uint32_t new_size;
  long lVar39;
  ulong uVar40;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM1 [16];
  image lvl_rgb;
  vector<basisu::image> local_138;
  image *local_128;
  uint local_11c;
  vector<basisu::image> local_118;
  image alpha_data;
  uint local_dc;
  elemental_vector local_d8;
  elemental_vector local_c8;
  ulong local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  source_filenames;
  vector<basisu::image> source_images;
  uint local_7c;
  
  debug_printf("basis_compressor::read_source_images\n");
  uVar20 = *(uint *)((long)&(this->m_params).m_source_filenames.m_size +
                    (ulong)(((this->m_params).m_read_source_images.m_value ^ 1) << 5));
  if (uVar20 == 0) {
    return false;
  }
  vec = &this->m_stats;
  uVar21 = (ulong)(this->m_stats).m_size;
  if (uVar21 != 0) {
    lVar39 = uVar21 * 0x68;
    paVar31 = &(vec->m_p->m_filename).field_2;
    do {
      if (paVar31 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar31->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar31->_M_allocated_capacity)[-2],
                        paVar31->_M_allocated_capacity + 1);
      }
      paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar31->_M_allocated_capacity + 0xd);
      lVar39 = lVar39 + -0x68;
    } while (lVar39 != 0);
    (this->m_stats).m_size = 0;
  }
  if ((this->m_slice_descs).m_size != 0) {
    (this->m_slice_descs).m_size = 0;
  }
  vec_00 = &this->m_slice_images;
  uVar21 = (ulong)(this->m_slice_images).m_size;
  if (uVar21 != 0) {
    piVar23 = vec_00->m_p;
    lVar39 = 0;
    do {
      pvVar7 = *(void **)((long)&(piVar23->m_pixels).m_p + lVar39);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
      }
      lVar39 = lVar39 + 0x20;
    } while (uVar21 << 5 != lVar39);
    (this->m_slice_images).m_size = 0;
  }
  this_00 = &this->m_slice_descs;
  this->m_total_blocks = 0;
  this->m_any_source_image_has_alpha = false;
  source_images.m_p = (image *)0x0;
  source_images.m_size = 0;
  source_images.m_capacity = 0;
  source_filenames.m_p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  source_filenames.m_size = 0;
  source_filenames.m_capacity = 0;
  uVar21 = (ulong)(uVar20 + (uVar20 == 0));
  uVar32 = 0;
  do {
    lvl_rgb.m_width = 0;
    lvl_rgb.m_height = 0;
    lvl_rgb.m_pitch = 0;
    lvl_rgb.m_pixels.m_p = (color_rgba *)0x0;
    lvl_rgb.m_pixels.m_size = 0;
    lvl_rgb.m_pixels.m_capacity = 0;
    if ((this->m_params).m_read_source_images.m_value == true) {
      if ((this->m_params).m_source_filenames.m_size <= uVar32) goto LAB_00219caa;
      local_128 = (image *)(this->m_params).m_source_filenames.m_p[uVar32]._M_dataplus._M_p;
      bVar16 = load_image((char *)local_128,&lvl_rgb);
      if (bVar16) {
        if ((this->m_params).m_status_output.m_value == true) {
          printf("Read source image \"%s\", %ux%u\n",local_128,lvl_rgb._0_8_ & 0xffffffff);
        }
        if (((this->m_params).m_source_alpha_filenames.m_size <= uVar32) ||
           (pbVar22 = (this->m_params).m_source_alpha_filenames.m_p,
           pbVar22[uVar32]._M_string_length == 0)) goto LAB_002185cf;
        pcVar36 = pbVar22[uVar32]._M_dataplus._M_p;
        alpha_data.m_width = 0;
        alpha_data.m_height = 0;
        alpha_data.m_pitch = 0;
        alpha_data.m_pixels.m_p = (color_rgba *)0x0;
        alpha_data.m_pixels.m_size = 0;
        alpha_data.m_pixels.m_capacity = 0;
        bVar16 = load_image(pcVar36,&alpha_data);
        if (bVar16) {
          printf("Read source alpha image \"%s\", %ux%u\n",pcVar36,alpha_data._0_8_ & 0xffffffff,
                 (ulong)alpha_data._0_8_ >> 0x20);
          image::crop(&alpha_data,lvl_rgb.m_width,lvl_rgb.m_height,0xffffffff,
                      (color_rgba *)&g_black_color,true);
          if (lvl_rgb.m_height != 0) {
            uVar18 = 0;
            do {
              if (lvl_rgb.m_width != 0) {
                uVar25 = 0;
                do {
                  if ((alpha_data.m_width <= uVar25) || (alpha_data.m_height <= uVar18))
                  goto LAB_00219b78;
                  uVar33 = alpha_data.m_pitch * uVar18 + uVar25;
                  if (alpha_data.m_pixels.m_size <= uVar33) goto LAB_00219b59;
                  if (lvl_rgb.m_height <= uVar18) goto LAB_00219b78;
                  uVar29 = lvl_rgb.m_pitch * uVar18 + uVar25;
                  if (lvl_rgb.m_pixels.m_size <= uVar29) goto LAB_00219b59;
                  lvl_rgb.m_pixels.m_p[uVar29].field_0.m_comps[3] =
                       (uint8_t)((uint)alpha_data.m_pixels.m_p[uVar33].field_0.m_comps[2] * 0x1279 +
                                 (uint)alpha_data.m_pixels.m_p[uVar33].field_0.m_comps[1] * 0xb715 +
                                 (uint)alpha_data.m_pixels.m_p[uVar33].field_0.m_comps[0] * 0x3672 +
                                 0x8000 >> 0x10);
                  uVar25 = uVar25 + 1;
                } while (uVar25 < lvl_rgb.m_width);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < lvl_rgb.m_height);
          }
        }
        else {
          error_printf("Failed reading source image: %s\n",pcVar36);
        }
        if (alpha_data.m_pixels.m_p != (color_rgba *)0x0) {
          free(alpha_data.m_pixels.m_p);
        }
        if (bVar16) goto LAB_002185cf;
      }
      else {
        error_printf("Failed reading source image: %s\n",local_128);
      }
LAB_00219832:
      if (lvl_rgb.m_pixels.m_p != (color_rgba *)0x0) {
        free(lvl_rgb.m_pixels.m_p);
      }
      goto LAB_00219841;
    }
    if ((this->m_params).m_source_images.m_size <= uVar32) goto LAB_00219bdc;
    image::operator=(&lvl_rgb,(this->m_params).m_source_images.m_p + uVar32);
    local_128 = (image *)0x2ffa61;
LAB_002185cf:
    if ((this->m_params).m_renormalize.m_value == true) {
      image::renormalize_normal_map(&lvl_rgb);
    }
    if (*(int *)(this->m_params).m_swizzle == 0x3020100) {
      bVar16 = false;
    }
    else {
      if (lvl_rgb.m_height != 0) {
        uVar18 = 0;
        do {
          if (lvl_rgb.m_width != 0) {
            uVar25 = 0;
            do {
              if (lvl_rgb.m_height <= uVar18) {
LAB_00219b78:
                __assert_fail("x < m_width && y < m_height",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0xb01,"color_rgba &basisu::image::operator()(uint32_t, uint32_t)");
              }
              uVar33 = lvl_rgb.m_pitch * uVar18 + uVar25;
              if (lvl_rgb.m_pixels.m_size <= uVar33) goto LAB_00219b59;
              uVar40 = (ulong)(byte)(this->m_params).m_swizzle[0];
              if ((((3 < uVar40) ||
                   (uVar35 = (ulong)(byte)(this->m_params).m_swizzle[1], 3 < uVar35)) ||
                  (uVar37 = (ulong)(byte)(this->m_params).m_swizzle[2], 3 < uVar37)) ||
                 (uVar38 = (ulong)(byte)(this->m_params).m_swizzle[3], 3 < uVar38)) {
LAB_00219b32:
                __assert_fail("index < 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0x374,"const uint8_t &basisu::color_rgba::operator[](uint32_t) const"
                             );
              }
              pcVar30 = lvl_rgb.m_pixels.m_p + uVar33;
              uVar2 = (pcVar30->field_0).m_comps[uVar35];
              uVar3 = (pcVar30->field_0).m_comps[uVar37];
              uVar4 = (pcVar30->field_0).m_comps[uVar38];
              (pcVar30->field_0).m_comps[0] = (pcVar30->field_0).m_comps[uVar40];
              (pcVar30->field_0).m_comps[1] = uVar2;
              (pcVar30->field_0).m_comps[2] = uVar3;
              (pcVar30->field_0).m_comps[3] = uVar4;
              uVar25 = uVar25 + 1;
            } while (uVar25 < lvl_rgb.m_width);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < lvl_rgb.m_height);
      }
      bVar16 = (this->m_params).m_swizzle[3] != '\x03';
    }
    bVar17 = true;
    if (((this->m_params).m_force_alpha.m_value == false) && (!bVar16)) {
      if ((this->m_params).m_check_for_alpha.m_value == false) {
        image::set_alpha(&lvl_rgb,0xff);
        bVar17 = false;
      }
      else {
        bVar17 = image::has_alpha(&lvl_rgb);
      }
    }
    if (bVar17 != false) {
      this->m_any_source_image_has_alpha = true;
    }
    debug_printf("Source image index %u filename %s %ux%u has alpha: %u\n",uVar32 & 0xffffffff,
                 local_128,lvl_rgb._0_8_ & 0xffffffff);
    if ((this->m_params).m_y_flip.m_value == true) {
      image::flip_y(&lvl_rgb);
    }
    uVar18 = (this->m_params).m_resample_width.m_value;
    if (((int)uVar18 < 1) || (uVar25 = (this->m_params).m_resample_height.m_value, (int)uVar25 < 1))
    {
      fVar1 = (this->m_params).m_resample_factor.m_value;
      if (0.0 < fVar1) {
        auVar41._4_12_ = in_XMM1._4_12_;
        auVar41._0_4_ = (float)(lvl_rgb._0_8_ & 0xffffffff) * fVar1;
        auVar41 = roundss(auVar41,auVar41,10);
        uVar18 = (int)auVar41._0_4_;
        if ((int)auVar41._0_4_ < 2) {
          uVar18 = 1;
        }
        if (0x3fff < (int)uVar18) {
          uVar18 = 0x4000;
        }
        in_XMM1 = ZEXT416((uint)((float)((ulong)lvl_rgb._0_8_ >> 0x20) * fVar1));
        auVar41 = roundss(ZEXT416(0),in_XMM1,10);
        uVar25 = (uint)auVar41._0_4_;
        if ((int)uVar25 < 2) {
          uVar25 = 1;
        }
        if (0x3fff < (int)uVar25) {
          uVar25 = 0x4000;
        }
        debug_printf("Resampling to %ix%i\n",(ulong)uVar18,(ulong)uVar25);
        image::image(&alpha_data,uVar18,uVar25,0xffffffff);
        image_resample(&lvl_rgb,&alpha_data,(this->m_params).m_perceptual.m_value,"box",1.0,false,0,
                       4);
        uVar14 = lvl_rgb._0_8_;
        lvl_rgb._0_8_ = alpha_data._0_8_;
        uVar19 = lvl_rgb.m_pitch;
        lvl_rgb.m_pitch = alpha_data.m_pitch;
        pcVar30 = alpha_data.m_pixels.m_p;
        uVar15 = alpha_data.m_pixels._8_8_;
        alpha_data.m_pixels._8_8_ = lvl_rgb.m_pixels._8_8_;
        alpha_data.m_pixels.m_p = lvl_rgb.m_pixels.m_p;
        goto joined_r0x00218913;
      }
    }
    else {
      if (0x3fff < (int)uVar18) {
        uVar18 = 0x4000;
      }
      if (0x3fff < (int)uVar25) {
        uVar25 = 0x4000;
      }
      debug_printf("Resampling to %ix%i\n",(ulong)uVar18,(ulong)uVar25);
      image::image(&alpha_data,uVar18,uVar25,0xffffffff);
      image_resample(&lvl_rgb,&alpha_data,(this->m_params).m_perceptual.m_value,"box",1.0,false,0,4)
      ;
      uVar14 = lvl_rgb._0_8_;
      lvl_rgb._0_8_ = alpha_data._0_8_;
      uVar19 = lvl_rgb.m_pitch;
      lvl_rgb.m_pitch = alpha_data.m_pitch;
      pcVar30 = alpha_data.m_pixels.m_p;
      uVar15 = alpha_data.m_pixels._8_8_;
      alpha_data.m_pixels._8_8_ = lvl_rgb.m_pixels._8_8_;
      alpha_data.m_pixels.m_p = lvl_rgb.m_pixels.m_p;
joined_r0x00218913:
      lvl_rgb.m_pixels._8_8_ = uVar15;
      lvl_rgb.m_pixels.m_p = pcVar30;
      alpha_data.m_pitch = uVar19;
      alpha_data._0_8_ = uVar14;
      if (alpha_data.m_pixels.m_p != (color_rgba *)0x0) {
        free(alpha_data.m_pixels.m_p);
      }
    }
    piVar23 = source_images.m_p;
    if ((lvl_rgb.m_width == 0) || (lvl_rgb.m_height == 0)) {
      error_printf(
                  "basis_compressor::read_source_images: Source image has a zero width and/or height!\n"
                  );
      goto LAB_00219832;
    }
    if ((0x4000 < lvl_rgb.m_width) || (0x4000 < lvl_rgb.m_height)) {
      error_printf("basis_compressor::read_source_images: Source image \"%s\" is too large!\n",
                   local_128);
      goto LAB_00219832;
    }
    uVar40 = source_images._8_8_ & 0xffffffff;
    uVar18 = source_images.m_size + 1;
    if (uVar18 == 0) {
      lVar39 = 0;
      do {
        pvVar7 = *(void **)((long)&(piVar23->m_pixels).m_p + lVar39);
        if (pvVar7 != (void *)0x0) {
          free(pvVar7);
        }
        lVar39 = lVar39 + 0x20;
      } while (lVar39 != 0x1fffffffe0);
    }
    else {
      if (source_images.m_capacity < uVar18) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&source_images,uVar18,true,0x20,
                   vector<basisu::image>::object_mover,false);
      }
      if (uVar18 - source_images.m_size != 0) {
        piVar23 = source_images.m_p + (source_images._8_8_ & 0xffffffff);
        piVar27 = piVar23 + (uVar18 - source_images.m_size);
        do {
          piVar23->m_width = 0;
          piVar23->m_height = 0;
          piVar23->m_pitch = 0;
          (piVar23->m_pixels).m_p = (color_rgba *)0x0;
          (piVar23->m_pixels).m_size = 0;
          (piVar23->m_pixels).m_capacity = 0;
          piVar23 = piVar23 + 1;
        } while (piVar23 != piVar27);
      }
    }
    source_images.m_size = uVar18;
    uVar19 = source_images.m_p[uVar40].m_width;
    source_images.m_p[uVar40].m_width = lvl_rgb.m_width;
    uVar5 = source_images.m_p[uVar40].m_height;
    source_images.m_p[uVar40].m_height = lvl_rgb.m_height;
    lvl_rgb.m_height = uVar5;
    lvl_rgb.m_width = uVar19;
    uVar19 = source_images.m_p[uVar40].m_pitch;
    source_images.m_p[uVar40].m_pitch = lvl_rgb.m_pitch;
    pcVar30 = source_images.m_p[uVar40].m_pixels.m_p;
    source_images.m_p[uVar40].m_pixels.m_p = lvl_rgb.m_pixels.m_p;
    uVar5 = source_images.m_p[uVar40].m_pixels.m_size;
    source_images.m_p[uVar40].m_pixels.m_size = lvl_rgb.m_pixels.m_size;
    uVar6 = source_images.m_p[uVar40].m_pixels.m_capacity;
    source_images.m_p[uVar40].m_pixels.m_capacity = lvl_rgb.m_pixels.m_capacity;
    lvl_rgb.m_pixels.m_capacity = uVar6;
    lvl_rgb.m_pixels.m_size = uVar5;
    lvl_rgb.m_pitch = uVar19;
    lvl_rgb.m_pixels.m_p = pcVar30;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&alpha_data,(char *)local_128,(allocator<char> *)&local_138);
    if ((source_filenames.m_p <= &alpha_data &&
         source_filenames.m_p !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       (&alpha_data < (image *)(source_filenames.m_p + (source_filenames._8_8_ & 0xffffffff)))) {
      pcVar36 = 
      "void basisu::vector<std::basic_string<char>>::push_back(const T &) [T = std::basic_string<char>]"
      ;
      goto LAB_00219c79;
    }
    if (source_filenames.m_capacity <= source_filenames.m_size) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&source_filenames,source_filenames.m_size + 1,true,0x20,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::object_mover,false);
    }
    source_filenames.m_p[source_filenames._8_8_ & 0xffffffff]._M_dataplus._M_p =
         (pointer)&source_filenames.m_p[source_filenames._8_8_ & 0xffffffff].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(source_filenames.m_p + (source_filenames._8_8_ & 0xffffffff)),
               alpha_data._0_8_,CONCAT44(alpha_data._12_4_,alpha_data.m_pitch) + alpha_data._0_8_);
    source_filenames.m_size = source_filenames.m_size + 1;
    if ((color_rgba_vec *)alpha_data._0_8_ != &alpha_data.m_pixels) {
      operator_delete((void *)alpha_data._0_8_,
                      (ulong)((long)&(alpha_data.m_pixels.m_p)->field_0 + 1));
    }
    if (lvl_rgb.m_pixels.m_p != (color_rgba *)0x0) {
      free(lvl_rgb.m_pixels.m_p);
    }
    uVar32 = uVar32 + 1;
  } while (uVar32 != uVar21);
  uVar18 = (this->m_params).m_source_mipmap_images.m_size;
  if (uVar18 == 0) {
LAB_00218c17:
    debug_printf("Any source image has alpha: %u\n",(ulong)this->m_any_source_image_has_alpha);
    bVar16 = true;
    uVar32 = 0;
    local_7c = 0;
    do {
      if ((source_filenames._8_8_ & 0xffffffff) <= uVar32) goto LAB_00219caa;
      pbVar22 = source_filenames.m_p + uVar32;
      local_138.m_p = (image *)0x0;
      local_138.m_size = 0;
      local_138.m_capacity = 0;
      vector<basisu::image>::reserve(&local_138,0x20);
      piVar23 = local_138.m_p;
      if ((source_images._8_8_ & 0xffffffff) <= uVar32) goto LAB_00219bdc;
      piVar27 = source_images.m_p + uVar32;
      local_b0 = uVar32;
      if (local_138.m_size == 0) {
        if (local_138.m_capacity == 0) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_138,1,true,0x20,vector<basisu::image>::object_mover,
                     false);
        }
        if ((local_138._8_8_ & 0xffffffff) != 1) {
          piVar23 = local_138.m_p + (local_138._8_8_ & 0xffffffff);
          piVar28 = piVar23 + (1 - local_138.m_size);
          do {
            piVar23->m_width = 0;
            piVar23->m_height = 0;
            piVar23->m_pitch = 0;
            (piVar23->m_pixels).m_p = (color_rgba *)0x0;
            (piVar23->m_pixels).m_size = 0;
            (piVar23->m_pixels).m_capacity = 0;
            piVar23 = piVar23 + 1;
          } while (piVar23 != piVar28);
        }
LAB_00218d61:
        local_138.m_size = 1;
      }
      else if (local_138.m_size != 1) {
        uVar18 = local_138.m_size - 1;
        lVar39 = 0;
        do {
          pvVar7 = *(void **)((long)&piVar23[1].m_pixels.m_p + lVar39);
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
          lVar39 = lVar39 + 0x20;
        } while ((ulong)uVar18 << 5 != lVar39);
        goto LAB_00218d61;
      }
      if ((this->m_params).m_source_mipmap_images.m_size == 0) {
        if (((this->m_params).m_mip_gen.m_value != true) ||
           (bVar17 = generate_mipmaps(this,piVar27,&local_138,this->m_any_source_image_has_alpha),
           bVar17)) goto LAB_00218f29;
        bVar17 = false;
        uVar32 = local_b0;
      }
      else {
        if ((this->m_params).m_source_mipmap_images.m_size <= local_b0) goto LAB_00219c31;
        uVar32 = 0;
        while (pvVar8 = (this->m_params).m_source_mipmap_images.m_p,
              uVar32 < pvVar8[local_b0].m_size) {
          piVar23 = pvVar8[local_b0].m_p + uVar32;
          if ((*(int *)(this->m_params).m_swizzle != 0x3020100) && (piVar23->m_height != 0)) {
            uVar18 = 0;
            do {
              if (piVar23->m_width != 0) {
                uVar25 = 0;
                do {
                  if (piVar23->m_height <= uVar18) goto LAB_00219b78;
                  uVar33 = piVar23->m_pitch * uVar18 + uVar25;
                  if ((piVar23->m_pixels).m_size <= uVar33) goto LAB_00219b59;
                  uVar40 = (ulong)(byte)(this->m_params).m_swizzle[0];
                  if ((((3 < uVar40) ||
                       (uVar35 = (ulong)(byte)(this->m_params).m_swizzle[1], 3 < uVar35)) ||
                      (uVar37 = (ulong)(byte)(this->m_params).m_swizzle[2], 3 < uVar37)) ||
                     (uVar38 = (ulong)(byte)(this->m_params).m_swizzle[3], 3 < uVar38))
                  goto LAB_00219b32;
                  pcVar30 = (piVar23->m_pixels).m_p + uVar33;
                  uVar2 = (pcVar30->field_0).m_comps[uVar35];
                  uVar3 = (pcVar30->field_0).m_comps[uVar37];
                  uVar4 = (pcVar30->field_0).m_comps[uVar38];
                  (pcVar30->field_0).m_comps[0] = (pcVar30->field_0).m_comps[uVar40];
                  (pcVar30->field_0).m_comps[1] = uVar2;
                  (pcVar30->field_0).m_comps[2] = uVar3;
                  (pcVar30->field_0).m_comps[3] = uVar4;
                  uVar25 = uVar25 + 1;
                } while (uVar25 < piVar23->m_width);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < piVar23->m_height);
          }
          if (((local_138.m_p != (image *)0x0) && (local_138.m_p <= piVar23)) &&
             (piVar23 < local_138.m_p + (local_138._8_8_ & 0xffffffff))) goto LAB_00219c4b;
          if (local_138.m_capacity <= local_138.m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_138,local_138.m_size + 1,true,0x20,
                       vector<basisu::image>::object_mover,false);
          }
          image::image(local_138.m_p + (local_138._8_8_ & 0xffffffff),piVar23);
          local_138.m_size = local_138.m_size + 1;
          uVar32 = uVar32 + 1;
          if ((this->m_params).m_source_mipmap_images.m_size <= local_b0) goto LAB_00219c31;
        }
LAB_00218f29:
        if (local_138.m_size == 0) goto LAB_00219bdc;
        image::swap(local_138.m_p,piVar27);
        uVar32 = local_b0;
        uVar19 = local_138.m_size;
        local_c8.m_p = (uint *)0x0;
        local_c8.m_size = 0;
        local_c8.m_capacity = 0;
        if (local_138.m_size != 0) {
          elemental_vector::increase_capacity
                    (&local_c8,local_138.m_size,local_138.m_size == 1,4,(object_mover)0x0,false);
          memset((uint *)((long)local_c8.m_p + (local_c8._8_8_ & 0xffffffff) * 4),0,
                 (ulong)(uVar19 - local_c8.m_size) << 2);
          local_c8.m_size = uVar19;
        }
        if (local_138.m_size != 0) {
          uVar40 = 0;
          do {
            if ((local_c8._8_8_ & 0xffffffff) <= uVar40) goto LAB_00219bc5;
            *(uint *)((long)local_c8.m_p + uVar40 * 4) = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < (local_138._8_8_ & 0xffffffff));
        }
        if ((this->m_any_source_image_has_alpha != false) &&
           ((this->m_params).m_uastc.m_value == false)) {
          local_118.m_p = (image *)0x0;
          local_118.m_size = 0;
          local_118.m_capacity = 0;
          local_d8.m_p = (uint *)0x0;
          local_d8.m_size = 0;
          local_d8.m_capacity = 0;
          vector<basisu::image>::reserve(&local_118,(ulong)(local_138.m_size * 2));
          local_11c = 0;
          uVar19 = local_138.m_size;
          if (local_138.m_size != 0) {
            uVar40 = 0;
            do {
              image::image(&lvl_rgb,local_138.m_p + uVar40);
              image::image(&alpha_data,&lvl_rgb);
              if (alpha_data.m_height != 0) {
                uVar18 = 0;
                auVar41 = extraout_XMM0;
                do {
                  if (alpha_data.m_width != 0) {
                    uVar25 = 0;
                    do {
                      if (alpha_data.m_height <= uVar18) goto LAB_00219b78;
                      uVar33 = alpha_data.m_pitch * uVar18 + uVar25;
                      if (alpha_data.m_pixels.m_size <= uVar33) goto LAB_00219b59;
                      auVar41 = pmovsxbq(auVar41,0xffff);
                      auVar42._8_8_ = auVar41._8_8_;
                      auVar42._0_8_ =
                           auVar41._0_8_ & 0xffffffffffffff00 |
                           (ulong)alpha_data.m_pixels.m_p[uVar33].field_0.m_comps[3];
                      auVar41 = pshufb(auVar42,_DAT_0027d760);
                      alpha_data.m_pixels.m_p[uVar33].field_0 = auVar41._0_4_;
                      uVar25 = uVar25 + 1;
                    } while (uVar25 < alpha_data.m_width);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 < alpha_data.m_height);
              }
              image::set_alpha(&lvl_rgb,0xff);
              if ((local_118.m_p <= &lvl_rgb && local_118.m_p != (image *)0x0) &&
                 (&lvl_rgb < local_118.m_p + (local_118._8_8_ & 0xffffffff))) goto LAB_00219c4b;
              if (local_118.m_capacity <= local_118.m_size) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)&local_118,local_118.m_size + 1,true,0x20,
                           vector<basisu::image>::object_mover,false);
              }
              image::image(local_118.m_p + (local_118._8_8_ & 0xffffffff),&lvl_rgb);
              local_118.m_size = local_118.m_size + 1;
              if ((local_d8.m_p <= &local_11c && (uint *)local_d8.m_p != (uint *)0x0) &&
                  &local_11c < (uint *)((long)local_d8.m_p + (local_d8._8_8_ & 0xffffffff) * 4)) {
LAB_00219c64:
                pcVar36 = 
                "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]";
                goto LAB_00219c79;
              }
              if (local_d8.m_capacity <= local_d8.m_size) {
                elemental_vector::increase_capacity
                          (&local_d8,local_d8.m_size + 1,true,4,(object_mover)0x0,false);
              }
              *(uint *)((long)local_d8.m_p + (local_d8._8_8_ & 0xffffffff) * 4) = local_11c;
              local_d8.m_size = local_d8.m_size + 1;
              if ((local_118.m_p <= &alpha_data && local_118.m_p != (image *)0x0) &&
                 (&alpha_data < local_118.m_p + (local_118._8_8_ & 0xffffffff))) goto LAB_00219c4b;
              if (local_118.m_capacity <= local_118.m_size) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)&local_118,local_118.m_size + 1,true,0x20,
                           vector<basisu::image>::object_mover,false);
              }
              image::image(local_118.m_p + (local_118._8_8_ & 0xffffffff),&alpha_data);
              local_118.m_size = local_118.m_size + 1;
              if (&local_11c < (uint *)((long)local_d8.m_p + (local_d8._8_8_ & 0xffffffff) * 4) &&
                  (local_d8.m_p <= &local_11c && (uint *)local_d8.m_p != (uint *)0x0))
              goto LAB_00219c64;
              if (local_d8.m_capacity <= local_d8.m_size) {
                elemental_vector::increase_capacity
                          (&local_d8,local_d8.m_size + 1,true,4,(object_mover)0x0,false);
              }
              *(uint *)((long)local_d8.m_p + (local_d8._8_8_ & 0xffffffff) * 4) = local_11c;
              local_d8.m_size = local_d8.m_size + 1;
              if (alpha_data.m_pixels.m_p != (color_rgba *)0x0) {
                free(alpha_data.m_pixels.m_p);
              }
              if (lvl_rgb.m_pixels.m_p != (color_rgba *)0x0) {
                free(lvl_rgb.m_pixels.m_p);
              }
              local_11c = local_11c + 1;
              uVar40 = (ulong)local_11c;
              uVar19 = local_138.m_size;
            } while (local_11c < local_138.m_size);
          }
          uVar14 = local_c8._8_8_;
          pvVar7 = local_c8.m_p;
          piVar23 = local_138.m_p;
          uVar5 = local_138.m_capacity;
          local_138.m_p = local_118.m_p;
          local_138.m_size = local_118.m_size;
          local_138.m_capacity = local_118.m_capacity;
          local_118.m_p = piVar23;
          local_118.m_capacity = uVar5;
          local_118.m_size = uVar19;
          local_c8.m_p = local_d8.m_p;
          local_c8.m_size = local_d8.m_size;
          local_c8.m_capacity = local_d8.m_capacity;
          uVar15 = local_c8._8_8_;
          local_d8.m_p = pvVar7;
          local_c8.m_size = (uint32_t)uVar14;
          local_c8.m_capacity = SUB84(uVar14,4);
          local_d8.m_size = local_c8.m_size;
          local_d8.m_capacity = local_c8.m_capacity;
          local_c8._8_8_ = uVar15;
          if ((uint *)pvVar7 != (uint *)0x0) {
            free(pvVar7);
          }
          piVar23 = local_118.m_p;
          if (local_118.m_p != (image *)0x0) {
            uVar32 = local_118._8_8_ & 0xffffffff;
            if (uVar32 != 0) {
              lVar39 = 0;
              do {
                pvVar7 = *(void **)((long)&(piVar23->m_pixels).m_p + lVar39);
                if (pvVar7 != (void *)0x0) {
                  free(pvVar7);
                }
                lVar39 = lVar39 + 0x20;
              } while (uVar32 << 5 != lVar39);
            }
            free(local_118.m_p);
            uVar32 = local_b0;
          }
        }
        if (local_138.m_size != local_c8.m_size) {
          __assert_fail("slices.size() == mip_indices.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                        ,0x2ec,"bool basisu::basis_compressor::read_source_images()");
        }
        if (local_138.m_size != 0) {
          lVar39 = 0;
          uVar40 = 0;
          do {
            local_128 = (image *)((long)&(local_138.m_p)->m_width + lVar39);
            uVar18 = *(uint *)((long)&(local_138.m_p)->m_width + lVar39);
            uVar25 = *(uint *)((long)&(local_138.m_p)->m_height + lVar39);
            local_dc = (uint)uVar40;
            if (this->m_any_source_image_has_alpha == true) {
              if ((this->m_params).m_uastc.m_value == true) {
                bVar17 = image::has_alpha(local_128);
                local_dc = (uint)bVar17;
              }
            }
            else {
              local_dc = 0;
            }
            image::crop_dup_borders
                      (local_128,local_128->m_width + 3 & 0xfffffffc,
                       local_128->m_height + 3 & 0xfffffffc);
            if ((this->m_params).m_debug_images.m_value == true) {
              string_format_abi_cxx11_
                        ((string *)&lvl_rgb,"basis_debug_source_image_%u_slice_%u.png",
                         uVar32 & 0xffffffff);
              save_png((char *)lvl_rgb._0_8_,local_128,0,0);
              if ((color_rgba_vec *)lvl_rgb._0_8_ != &lvl_rgb.m_pixels) {
                operator_delete((void *)lvl_rgb._0_8_,
                                (ulong)((long)&(lvl_rgb.m_pixels.m_p)->field_0 + 1));
              }
            }
            uVar33 = (this->m_slice_images).m_size;
            enlarge_vector<basisu::vector<basisu::image_stats>>(vec,1);
            enlarge_vector<basisu::vector<basisu::image>>(vec_00,1);
            uVar19 = (this->m_slice_descs).m_size;
            if (uVar19 == 0xffffffff) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                            ,0x217,
                            "void basisu::vector<basisu::basisu_backend_slice_desc>::resize(size_t, bool) [T = basisu::basisu_backend_slice_desc]"
                           );
            }
            uVar29 = uVar19 + 1;
            if ((this->m_slice_descs).m_capacity < uVar29) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,uVar29,true,0x30,(object_mover)0x0,false);
            }
            uVar34 = (this->m_slice_descs).m_size;
            if (uVar29 != uVar34) {
              memset(this_00->m_p + uVar34,0,
                     (((ulong)(uVar29 - uVar34) * 0x30 - 0x30) / 0x30) * 0x30 + 0x30);
            }
            (this->m_slice_descs).m_size = uVar29;
            if ((this->m_stats).m_size <= uVar33) {
LAB_00219bf8:
              pcVar36 = 
              "T &basisu::vector<basisu::image_stats>::operator[](size_t) [T = basisu::image_stats]"
              ;
              goto LAB_00219b6e;
            }
            pcVar36 = (pbVar22->_M_dataplus)._M_p;
            piVar9 = vec->m_p;
            pcVar10 = (char *)piVar9[uVar33].m_filename._M_string_length;
            strlen(pcVar36);
            std::__cxx11::string::_M_replace((ulong)(piVar9 + uVar33),0,pcVar10,(ulong)pcVar36);
            uVar32 = local_b0;
            if (((this->m_stats).m_size <= uVar33) ||
               ((this->m_stats).m_p[uVar33].m_width = uVar18, (this->m_stats).m_size <= uVar33))
            goto LAB_00219bf8;
            vec->m_p[uVar33].m_height = uVar25;
            if ((local_c8._8_8_ & 0xffffffff) <= uVar40) goto LAB_00219bc5;
            debug_printf("****** Slice %u: mip %u, alpha_slice: %u, filename: \"%s\", original: %ux%u actual: %ux%u\n"
                         ,(ulong)((this->m_slice_descs).m_size - 1),
                         (ulong)*(uint *)((long)local_c8.m_p + uVar40 * 4),(ulong)(local_dc & 1),
                         (pbVar22->_M_dataplus)._M_p,(ulong)uVar18,(ulong)uVar25,
                         (ulong)local_128->m_width,(ulong)local_128->m_height);
            if ((this->m_slice_descs).m_size <= uVar33) goto LAB_00219baa;
            pbVar11 = (this->m_slice_descs).m_p;
            pbVar11[uVar33].m_first_block_index = this->m_total_blocks;
            pbVar11[uVar33].m_orig_width = uVar18;
            pbVar11[uVar33].m_orig_height = uVar25;
            pbVar11[uVar33].m_width = local_128->m_width;
            pbVar11[uVar33].m_height = local_128->m_height;
            uVar18 = local_128->m_width + 3;
            uVar25 = uVar18 >> 2;
            pbVar11[uVar33].m_num_blocks_x = uVar25;
            uVar29 = local_128->m_height + 3;
            uVar34 = uVar29 >> 2;
            pbVar11[uVar33].m_num_blocks_y = uVar34;
            pbVar11[uVar33].m_num_macroblocks_x = uVar25 - (uVar18 >> 3);
            pbVar11[uVar33].m_num_macroblocks_y = uVar34 - (uVar29 >> 3);
            pbVar11[uVar33].m_source_file_index = (uint32_t)uVar32;
            if ((local_c8._8_8_ & 0xffffffff) <= uVar40) goto LAB_00219bc5;
            pbVar11[uVar33].m_mip_index = *(uint *)((long)local_c8.m_p + uVar40 * 4);
            pbVar11[uVar33].m_alpha = (bool)((byte)local_dc & 1);
            pbVar11[uVar33].m_iframe = false;
            pbVar11[uVar33].m_iframe =
                 (this->m_params).m_tex_type == cBASISTexTypeVideoFrames && uVar32 == 0;
            this->m_total_blocks =
                 this->m_total_blocks +
                 pbVar11[uVar33].m_num_blocks_y * pbVar11[uVar33].m_num_blocks_x;
            if ((this->m_slice_images).m_size <= uVar33) goto LAB_00219bdc;
            local_7c = local_7c +
                       pbVar11[uVar33].m_num_macroblocks_y * pbVar11[uVar33].m_num_macroblocks_x;
            image::swap(vec_00->m_p + uVar33,local_128);
            uVar40 = uVar40 + 1;
            lVar39 = lVar39 + 0x20;
          } while (uVar40 < (local_138._8_8_ & 0xffffffff));
        }
        if ((uint *)local_c8.m_p != (uint *)0x0) {
          free(local_c8.m_p);
        }
        bVar17 = true;
      }
      piVar23 = local_138.m_p;
      if (local_138.m_p != (image *)0x0) {
        uVar32 = local_138._8_8_ & 0xffffffff;
        if (uVar32 != 0) {
          lVar39 = 0;
          do {
            pvVar7 = *(void **)((long)&(piVar23->m_pixels).m_p + lVar39);
            if (pvVar7 != (void *)0x0) {
              free(pvVar7);
            }
            lVar39 = lVar39 + 0x20;
          } while (uVar32 << 5 != lVar39);
        }
        free(local_138.m_p);
        uVar32 = local_b0;
      }
      if (!bVar17) break;
      uVar32 = uVar32 + 1;
      bVar16 = uVar32 < uVar20;
    } while (uVar32 != uVar21);
    if (bVar16) {
LAB_00219841:
      bVar16 = false;
      goto LAB_00219843;
    }
    debug_printf("Total blocks: %u, Total macroblocks: %u\n",(ulong)this->m_total_blocks,
                 (ulong)local_7c);
    uVar20 = (this->m_slice_descs).m_size;
    if (uVar20 < 0x1000000) {
      if (1 < uVar20) {
        iVar26 = uVar20 - 1;
        puVar24 = &this_00->m_p[1].m_mip_index;
        do {
          if ((1 < (int)(puVar24[-1] - puVar24[-0xd])) ||
             ((puVar24[-1] == puVar24[-0xd] && (1 < (int)(*puVar24 - puVar24[-0xc])))))
          goto LAB_00219841;
          puVar24 = puVar24 + 0xc;
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
      }
      if ((this->m_params).m_status_output.m_value == true) {
        printf("Total basis file slices: %u\n");
      }
      bVar16 = (this->m_slice_descs).m_size == 0;
      if (!bVar16) {
        lVar39 = 0x2d;
        uVar21 = 0;
        do {
          pbVar11 = (this->m_slice_descs).m_p;
          if ((this->m_params).m_status_output.m_value == true) {
            local_128 = (image *)(ulong)*(uint *)((long)pbVar11 + lVar39 + -0x2d);
            printf("Slice: %u, alpha: %u, orig width/height: %ux%u, width/height: %ux%u, first_block: %u, image_index: %u, mip_level: %u, iframe: %u\n"
                   ,uVar21,(ulong)*(byte *)((long)pbVar11 + lVar39 + -1),
                   (ulong)*(uint *)((long)pbVar11 + lVar39 + -0x29),
                   (ulong)*(uint *)((long)pbVar11 + lVar39 + -0x25),
                   (ulong)*(uint *)((long)pbVar11 + lVar39 + -0x21),
                   (ulong)*(uint *)((long)pbVar11 + lVar39 + -0x1d),local_128,
                   (ulong)*(uint *)((long)pbVar11 + lVar39 + -9),
                   (ulong)*(uint *)((long)pbVar11 + lVar39 + -5),
                   (ulong)*(byte *)((long)&pbVar11->m_first_block_index + lVar39));
          }
          if (this->m_any_source_image_has_alpha == true) {
            if ((this->m_params).m_uastc.m_value == false) {
              if (*(char *)((long)pbVar11 + lVar39 + -1) == '\x01') {
                if ((uVar21 & 1) == 0) break;
                uVar20 = (int)uVar21 - 1;
                if ((this->m_slice_descs).m_size <= uVar20) goto LAB_00219baa;
                pbVar13 = this_00->m_p;
                if ((((pbVar13[uVar20].m_source_file_index !=
                       *(uint32_t *)((long)pbVar11 + lVar39 + -9)) ||
                     (pbVar13[uVar20].m_alpha != false)) ||
                    (pbVar13[uVar20].m_mip_index != *(uint32_t *)((long)pbVar11 + lVar39 + -5))) ||
                   ((pbVar13[uVar20].m_num_blocks_x != *(uint32_t *)((long)pbVar11 + lVar39 + -0x19)
                    || (pbVar13[uVar20].m_num_blocks_y !=
                        *(uint32_t *)((long)pbVar11 + lVar39 + -0x15))))) break;
              }
              else if ((uVar21 & 1) != 0) break;
            }
          }
          else if (*(char *)((long)pbVar11 + lVar39 + -1) != '\0') break;
          if (((*(uint *)((long)pbVar11 + lVar39 + -0x21) <
                *(uint *)((long)pbVar11 + lVar39 + -0x29)) ||
              (*(uint *)((long)pbVar11 + lVar39 + -0x1d) < *(uint *)((long)pbVar11 + lVar39 + -0x25)
              )) || (((*(int *)((long)pbVar11 + lVar39 + -9) == 0 &&
                      ((this->m_params).m_tex_type == cBASISTexTypeVideoFrames)) &&
                     (*(char *)((long)&pbVar11->m_first_block_index + lVar39) != '\x01')))) break;
          uVar20 = (int)uVar21 + 1;
          uVar21 = (ulong)uVar20;
          lVar39 = lVar39 + 0x30;
          bVar16 = (this->m_slice_descs).m_size <= uVar20;
          if (bVar16) break;
        } while( true );
      }
      goto LAB_00219843;
    }
    pcVar36 = "Too many slices!\n";
  }
  else {
    uVar25 = (this->m_params).m_source_images.m_size;
    pcVar36 = 
    "basis_compressor::read_source_images(): m_params.m_source_mipmap_images.size() must equal m_params.m_source_images.size()!\n"
    ;
    if ((uVar25 == uVar18) && (uVar20 == uVar25)) {
      if (this->m_any_source_image_has_alpha == false) {
        uVar32 = 0;
        do {
          if ((this->m_params).m_source_mipmap_images.m_size <= uVar32) goto LAB_00219c31;
          uVar40 = 0xffffffffffffffff;
          lVar39 = 0;
          while( true ) {
            pvVar8 = (this->m_params).m_source_mipmap_images.m_p;
            uVar40 = uVar40 + 1;
            if (pvVar8[uVar32].m_size <= uVar40) break;
            bVar16 = image::has_alpha((image *)((long)&(pvVar8[uVar32].m_p)->m_width + lVar39));
            if (bVar16) {
              this->m_any_source_image_has_alpha = true;
              break;
            }
            lVar39 = lVar39 + 0x20;
            if ((this->m_params).m_source_mipmap_images.m_size <= uVar32) goto LAB_00219c31;
          }
        } while ((this->m_any_source_image_has_alpha == false) &&
                (uVar32 = uVar32 + 1, uVar32 != uVar21));
      }
      goto LAB_00218c17;
    }
  }
  bVar16 = false;
  error_printf(pcVar36);
LAB_00219843:
  if (source_filenames.m_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((source_filenames._8_8_ & 0xffffffff) != 0) {
      lVar39 = (source_filenames._8_8_ & 0xffffffff) << 5;
      paVar31 = &(source_filenames.m_p)->field_2;
      do {
        plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (paVar31 + -1))->_M_dataplus)._M_p;
        if (paVar31 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          operator_delete(plVar12,paVar31->_M_allocated_capacity + 1);
        }
        paVar31 = paVar31 + 2;
        lVar39 = lVar39 + -0x20;
      } while (lVar39 != 0);
    }
    free(source_filenames.m_p);
  }
  piVar23 = source_images.m_p;
  if (source_images.m_p != (image *)0x0) {
    uVar21 = source_images._8_8_ & 0xffffffff;
    if (uVar21 != 0) {
      lVar39 = 0;
      do {
        pvVar7 = *(void **)((long)&(piVar23->m_pixels).m_p + lVar39);
        if (pvVar7 != (void *)0x0) {
          free(pvVar7);
        }
        lVar39 = lVar39 + 0x20;
      } while (uVar21 << 5 != lVar39);
    }
    free(source_images.m_p);
  }
  return bVar16;
LAB_00219caa:
  pcVar36 = 
  "T &basisu::vector<std::basic_string<char>>::operator[](size_t) [T = std::basic_string<char>]";
  goto LAB_00219b6e;
LAB_00219bc5:
  pcVar36 = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
  goto LAB_00219b6e;
LAB_00219bdc:
  pcVar36 = "T &basisu::vector<basisu::image>::operator[](size_t) [T = basisu::image]";
  goto LAB_00219b6e;
LAB_00219baa:
  pcVar36 = 
  "T &basisu::vector<basisu::basisu_backend_slice_desc>::operator[](size_t) [T = basisu::basisu_backend_slice_desc]"
  ;
  goto LAB_00219b6e;
LAB_00219b59:
  pcVar36 = "T &basisu::vector<basisu::color_rgba>::operator[](size_t) [T = basisu::color_rgba]";
  goto LAB_00219b6e;
LAB_00219c4b:
  pcVar36 = "void basisu::vector<basisu::image>::push_back(const T &) [T = basisu::image]";
LAB_00219c79:
  __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x267,pcVar36);
LAB_00219c31:
  pcVar36 = 
  "T &basisu::vector<basisu::vector<basisu::image>>::operator[](size_t) [T = basisu::vector<basisu::image>]"
  ;
LAB_00219b6e:
  __assert_fail("i < m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x178,pcVar36);
}

Assistant:

bool basis_compressor::read_source_images()
	{
		debug_printf("basis_compressor::read_source_images\n");

		const uint32_t total_source_files = m_params.m_read_source_images ? (uint32_t)m_params.m_source_filenames.size() : (uint32_t)m_params.m_source_images.size();
		if (!total_source_files)
			return false;

		m_stats.resize(0);
		m_slice_descs.resize(0);
		m_slice_images.resize(0);

		m_total_blocks = 0;
		uint32_t total_macroblocks = 0;

		m_any_source_image_has_alpha = false;

		basisu::vector<image> source_images;
		basisu::vector<std::string> source_filenames;
		
		// First load all source images, and determine if any have an alpha channel.
		for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
		{
			const char *pSource_filename = "";

			image file_image;
			
			if (m_params.m_read_source_images)
			{
				pSource_filename = m_params.m_source_filenames[source_file_index].c_str();

				// Load the source image
				if (!load_image(pSource_filename, file_image))
				{
					error_printf("Failed reading source image: %s\n", pSource_filename);
					return false;
				}

				if (m_params.m_status_output)
				{
					printf("Read source image \"%s\", %ux%u\n", pSource_filename, file_image.get_width(), file_image.get_height());
				}

				// Optionally load another image and put a grayscale version of it into the alpha channel.
				if ((source_file_index < m_params.m_source_alpha_filenames.size()) && (m_params.m_source_alpha_filenames[source_file_index].size()))
				{
					const char *pSource_alpha_image = m_params.m_source_alpha_filenames[source_file_index].c_str();

					image alpha_data;

					if (!load_image(pSource_alpha_image, alpha_data))
					{
						error_printf("Failed reading source image: %s\n", pSource_alpha_image);
						return false;
					}

					printf("Read source alpha image \"%s\", %ux%u\n", pSource_alpha_image, alpha_data.get_width(), alpha_data.get_height());

					alpha_data.crop(file_image.get_width(), file_image.get_height());

					for (uint32_t y = 0; y < file_image.get_height(); y++)
						for (uint32_t x = 0; x < file_image.get_width(); x++)
							file_image(x, y).a = (uint8_t)alpha_data(x, y).get_709_luma();
				}
			}
			else
			{
				file_image = m_params.m_source_images[source_file_index];
			}

			if (m_params.m_renormalize)
				file_image.renormalize_normal_map();

			bool alpha_swizzled = false;
			if (m_params.m_swizzle[0] != 0 ||
				m_params.m_swizzle[1] != 1 ||
				m_params.m_swizzle[2] != 2 ||
				m_params.m_swizzle[3] != 3)
			{
				// Used for XY normal maps in RG - puts X in color, Y in alpha
				for (uint32_t y = 0; y < file_image.get_height(); y++)
					for (uint32_t x = 0; x < file_image.get_width(); x++)
					{
						const color_rgba &c = file_image(x, y);
						file_image(x, y).set_noclamp_rgba(c[m_params.m_swizzle[0]], c[m_params.m_swizzle[1]], c[m_params.m_swizzle[2]], c[m_params.m_swizzle[3]]);
					}
				alpha_swizzled = m_params.m_swizzle[3] != 3;
			}
						
			bool has_alpha = false;
			if (m_params.m_force_alpha || alpha_swizzled)
				has_alpha = true;
			else if (!m_params.m_check_for_alpha)
				file_image.set_alpha(255);
			else if (file_image.has_alpha())
				has_alpha = true;

			if (has_alpha)
				m_any_source_image_has_alpha = true;

			debug_printf("Source image index %u filename %s %ux%u has alpha: %u\n", source_file_index, pSource_filename, file_image.get_width(), file_image.get_height(), has_alpha);
												
			if (m_params.m_y_flip)
				file_image.flip_y();

#if DEBUG_EXTRACT_SINGLE_BLOCK
			image block_image(4, 4);
			const uint32_t block_x = 0;
			const uint32_t block_y = 0;
			block_image.blit(block_x * 4, block_y * 4, 4, 4, 0, 0, file_image, 0);
			file_image = block_image;
#endif

#if DEBUG_CROP_TEXTURE_TO_64x64
			file_image.resize(64, 64);
#endif

			if (m_params.m_resample_width > 0 && m_params.m_resample_height > 0)
			{
				int new_width = basisu::minimum<int>(m_params.m_resample_width, BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);
				int new_height = basisu::minimum<int>(m_params.m_resample_height, BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);

				debug_printf("Resampling to %ix%i\n", new_width, new_height);

				// TODO: A box filter - kaiser looks too sharp on video. Let the caller control this.
				image temp_img(new_width, new_height);
				image_resample(file_image, temp_img, m_params.m_perceptual, "box"); // "kaiser");
				temp_img.swap(file_image);
			}
			else if (m_params.m_resample_factor > 0.0f)
			{
				int new_width = basisu::minimum<int>(basisu::maximum(1, (int)ceilf(file_image.get_width() * m_params.m_resample_factor)), BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);
				int new_height = basisu::minimum<int>(basisu::maximum(1, (int)ceilf(file_image.get_height() * m_params.m_resample_factor)), BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION);

				debug_printf("Resampling to %ix%i\n", new_width, new_height);

				// TODO: A box filter - kaiser looks too sharp on video. Let the caller control this.
				image temp_img(new_width, new_height);
				image_resample(file_image, temp_img, m_params.m_perceptual, "box"); // "kaiser");
				temp_img.swap(file_image);
			}

			if ((!file_image.get_width()) || (!file_image.get_height()))
			{
				error_printf("basis_compressor::read_source_images: Source image has a zero width and/or height!\n");
				return false;
			}

			if ((file_image.get_width() > BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION) || (file_image.get_height() > BASISU_MAX_SUPPORTED_TEXTURE_DIMENSION))
			{
				error_printf("basis_compressor::read_source_images: Source image \"%s\" is too large!\n", pSource_filename);
				return false;
			}

			source_images.enlarge(1)->swap(file_image);
			source_filenames.push_back(pSource_filename);
		}

		// Check if the caller has generated their own mipmaps. 
		if (m_params.m_source_mipmap_images.size())
		{
			// Make sure they've passed us enough mipmap chains.
			if ((m_params.m_source_images.size() != m_params.m_source_mipmap_images.size()) || (total_source_files != m_params.m_source_images.size()))
			{
				error_printf("basis_compressor::read_source_images(): m_params.m_source_mipmap_images.size() must equal m_params.m_source_images.size()!\n");
				return false;
			}

			// Check if any of the user-supplied mipmap levels has alpha.
			// We're assuming the user has already preswizzled their mipmap source images.
			if (!m_any_source_image_has_alpha)
			{
				for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
				{
					for (uint32_t mip_index = 0; mip_index < m_params.m_source_mipmap_images[source_file_index].size(); mip_index++)
					{
						const image& mip_img = m_params.m_source_mipmap_images[source_file_index][mip_index];

						if (mip_img.has_alpha())
						{
							m_any_source_image_has_alpha = true;
							break;
						}
					}

					if (m_any_source_image_has_alpha)
						break;
				}
			}
		}

		debug_printf("Any source image has alpha: %u\n", m_any_source_image_has_alpha);

		for (uint32_t source_file_index = 0; source_file_index < total_source_files; source_file_index++)
		{
			const std::string &source_filename = source_filenames[source_file_index];

			// Now, for each source image, create the slices corresponding to that image.
			basisu::vector<image> slices;
			
			slices.reserve(32);
						
			// The first (largest) mipmap level.
			image& file_image = source_images[source_file_index];
						
			// Reserve a slot for mip0.
			slices.resize(1);
												
			if (m_params.m_source_mipmap_images.size())
			{
				// User-provided mipmaps for each layer or image in the texture array.
				for (uint32_t mip_index = 0; mip_index < m_params.m_source_mipmap_images[source_file_index].size(); mip_index++)
				{
					image& mip_img = m_params.m_source_mipmap_images[source_file_index][mip_index];

					if (m_params.m_swizzle[0] != 0 ||
						m_params.m_swizzle[1] != 1 ||
						m_params.m_swizzle[2] != 2 ||
						m_params.m_swizzle[3] != 3)
					{
						// Used for XY normal maps in RG - puts X in color, Y in alpha
						for (uint32_t y = 0; y < mip_img.get_height(); y++)
							for (uint32_t x = 0; x < mip_img.get_width(); x++)
							{
								const color_rgba &c = mip_img(x, y);
								mip_img(x, y).set_noclamp_rgba(c[m_params.m_swizzle[0]], c[m_params.m_swizzle[1]], c[m_params.m_swizzle[2]], c[m_params.m_swizzle[3]]);
							}
					}

					slices.push_back(mip_img);
				}
			}
			else if (m_params.m_mip_gen)
			{
				// Automatically generate mipmaps.
				if (!generate_mipmaps(file_image, slices, m_any_source_image_has_alpha))
					return false;
			}

			// Swap in the largest mipmap level here to avoid copying it, because generate_mips() will change the array.
			// NOTE: file_image is now blank.
			slices[0].swap(file_image);

			uint_vec mip_indices(slices.size());
			for (uint32_t i = 0; i < slices.size(); i++)
				mip_indices[i] = i;
						
			if ((m_any_source_image_has_alpha) && (!m_params.m_uastc))
			{
				// For ETC1S, if source has alpha, then even mips will have RGB, and odd mips will have alpha in RGB. 
				basisu::vector<image> alpha_slices;
				uint_vec new_mip_indices;

				alpha_slices.reserve(slices.size() * 2);

				for (uint32_t i = 0; i < slices.size(); i++)
				{
					image lvl_rgb(slices[i]);
					image lvl_a(lvl_rgb);

					for (uint32_t y = 0; y < lvl_a.get_height(); y++)
					{
						for (uint32_t x = 0; x < lvl_a.get_width(); x++)
						{
							uint8_t a = lvl_a(x, y).a;
							lvl_a(x, y).set_noclamp_rgba(a, a, a, 255);
						}
					}
					
					lvl_rgb.set_alpha(255);

					alpha_slices.push_back(lvl_rgb);
					new_mip_indices.push_back(i);

					alpha_slices.push_back(lvl_a);
					new_mip_indices.push_back(i);
				}

				slices.swap(alpha_slices);
				mip_indices.swap(new_mip_indices);
			}

			assert(slices.size() == mip_indices.size());
						
			for (uint32_t slice_index = 0; slice_index < slices.size(); slice_index++)
			{
				image& slice_image = slices[slice_index];
				const uint32_t orig_width = slice_image.get_width();
				const uint32_t orig_height = slice_image.get_height();

				bool is_alpha_slice = false;
				if (m_any_source_image_has_alpha)
				{
					if (m_params.m_uastc)
					{
						is_alpha_slice = slice_image.has_alpha();
					}
					else
					{
						is_alpha_slice = (slice_index & 1) != 0;
					}
				}

				// Enlarge the source image to 4x4 block boundaries, duplicating edge pixels if necessary to avoid introducing extra colors into blocks.
				slice_image.crop_dup_borders(slice_image.get_block_width(4) * 4, slice_image.get_block_height(4) * 4);

				if (m_params.m_debug_images)
				{
					save_png(string_format("basis_debug_source_image_%u_slice_%u.png", source_file_index, slice_index).c_str(), slice_image);
				}

				const uint32_t dest_image_index = m_slice_images.size();

				enlarge_vector(m_stats, 1);
				enlarge_vector(m_slice_images, 1);
				enlarge_vector(m_slice_descs, 1);
								
				m_stats[dest_image_index].m_filename = source_filename.c_str();
				m_stats[dest_image_index].m_width = orig_width;
				m_stats[dest_image_index].m_height = orig_height;
								
				debug_printf("****** Slice %u: mip %u, alpha_slice: %u, filename: \"%s\", original: %ux%u actual: %ux%u\n", m_slice_descs.size() - 1, mip_indices[slice_index], is_alpha_slice, source_filename.c_str(), orig_width, orig_height, slice_image.get_width(), slice_image.get_height());

				basisu_backend_slice_desc &slice_desc = m_slice_descs[dest_image_index];

				slice_desc.m_first_block_index = m_total_blocks;

				slice_desc.m_orig_width = orig_width;
				slice_desc.m_orig_height = orig_height;

				slice_desc.m_width = slice_image.get_width();
				slice_desc.m_height = slice_image.get_height();

				slice_desc.m_num_blocks_x = slice_image.get_block_width(4);
				slice_desc.m_num_blocks_y = slice_image.get_block_height(4);

				slice_desc.m_num_macroblocks_x = (slice_desc.m_num_blocks_x + 1) >> 1;
				slice_desc.m_num_macroblocks_y = (slice_desc.m_num_blocks_y + 1) >> 1;

				slice_desc.m_source_file_index = source_file_index;
				
				slice_desc.m_mip_index = mip_indices[slice_index];

				slice_desc.m_alpha = is_alpha_slice;
				slice_desc.m_iframe = false;
				if (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames)
				{
					slice_desc.m_iframe = (source_file_index == 0);
				}

				m_total_blocks += slice_desc.m_num_blocks_x * slice_desc.m_num_blocks_y;
				total_macroblocks += slice_desc.m_num_macroblocks_x * slice_desc.m_num_macroblocks_y;

				// Finally, swap in the slice's image to avoid copying it.
				// NOTE: slice_image is now blank.
				m_slice_images[dest_image_index].swap(slice_image);
			
			} // slice_index

		} // source_file_index

		debug_printf("Total blocks: %u, Total macroblocks: %u\n", m_total_blocks, total_macroblocks);

		// Make sure we don't have too many slices
		if (m_slice_descs.size() > BASISU_MAX_SLICES)
		{
			error_printf("Too many slices!\n");
			return false;
		}
				
		// Basic sanity check on the slices
		for (uint32_t i = 1; i < m_slice_descs.size(); i++)
		{
			const basisu_backend_slice_desc &prev_slice_desc = m_slice_descs[i - 1];
			const basisu_backend_slice_desc &slice_desc = m_slice_descs[i];

			// Make sure images are in order
			int image_delta = (int)slice_desc.m_source_file_index - (int)prev_slice_desc.m_source_file_index;
			if (image_delta > 1)
				return false;	

			// Make sure mipmap levels are in order
			if (!image_delta)
			{
				int level_delta = (int)slice_desc.m_mip_index - (int)prev_slice_desc.m_mip_index;
				if (level_delta > 1)
					return false;
			}
		}

		if (m_params.m_status_output)
		{
			printf("Total basis file slices: %u\n", (uint32_t)m_slice_descs.size());
		}

		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			const basisu_backend_slice_desc &slice_desc = m_slice_descs[i];

			if (m_params.m_status_output)
			{
				printf("Slice: %u, alpha: %u, orig width/height: %ux%u, width/height: %ux%u, first_block: %u, image_index: %u, mip_level: %u, iframe: %u\n",
					i, slice_desc.m_alpha, slice_desc.m_orig_width, slice_desc.m_orig_height, slice_desc.m_width, slice_desc.m_height, slice_desc.m_first_block_index, slice_desc.m_source_file_index, slice_desc.m_mip_index, slice_desc.m_iframe);
			}

			if (m_any_source_image_has_alpha)
			{
				if (!m_params.m_uastc)
				{
					// For ETC1S, alpha slices must be at odd slice indices.
					if (slice_desc.m_alpha)
					{
						if ((i & 1) == 0)
							return false;

						const basisu_backend_slice_desc& prev_slice_desc = m_slice_descs[i - 1];

						// Make sure previous slice has this image's color data
						if (prev_slice_desc.m_source_file_index != slice_desc.m_source_file_index)
							return false;
						if (prev_slice_desc.m_alpha)
							return false;
						if (prev_slice_desc.m_mip_index != slice_desc.m_mip_index)
							return false;
						if (prev_slice_desc.m_num_blocks_x != slice_desc.m_num_blocks_x)
							return false;
						if (prev_slice_desc.m_num_blocks_y != slice_desc.m_num_blocks_y)
							return false;
					}
					else if (i & 1)
						return false;
				}
			}
			else if (slice_desc.m_alpha)
			{
				return false;
			}

			if ((slice_desc.m_orig_width > slice_desc.m_width) || (slice_desc.m_orig_height > slice_desc.m_height))
				return false;
			if ((slice_desc.m_source_file_index == 0) && (m_params.m_tex_type == basist::cBASISTexTypeVideoFrames))
			{
				if (!slice_desc.m_iframe)
					return false;
			}
		}

		return true;
	}